

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreDeriveCexSat(Gia_ManAre_t *p,Gia_StaAre_t *pCur,Gia_StaAre_t *pNext,int iOutFailed)

{
  Gia_PtrAre_t GVar1;
  int iVar2;
  lit *begin;
  int iVar3;
  Gia_Man_t *pGVar4;
  sbyte sVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  p->vAssumps->nSize = 0;
  pGVar4 = p->pAig;
  iVar3 = pGVar4->nRegs;
  if (0 < iVar3) {
    uVar8 = 0;
    iVar9 = 0;
    do {
      if (((uint)(&pCur[1].iPrev)[(int)uVar8 >> 5] >> (uVar8 & 0x1e) & 1) == 0) {
        if (((uint)(&pCur[1].iPrev)[(int)uVar8 >> 5] >> (sbyte)(uVar8 & 0x1e) & 2) != 0) {
          uVar6 = (pGVar4->vCis->nSize - iVar3) + iVar9;
          if ((-1 < (int)uVar6) && ((int)uVar6 < p->vSatNumCis->nSize)) {
            iVar3 = p->vSatNumCis->pArray[uVar6];
            if (-1 < iVar3) {
              pVVar7 = p->vAssumps;
              iVar3 = iVar3 * 2;
              goto LAB_00734ba2;
            }
            goto LAB_00734f3f;
          }
          goto LAB_00734f01;
        }
      }
      else {
        uVar6 = (pGVar4->vCis->nSize - iVar3) + iVar9;
        if (((int)uVar6 < 0) || (p->vSatNumCis->nSize <= (int)uVar6)) goto LAB_00734f01;
        iVar3 = p->vSatNumCis->pArray[uVar6];
        if (iVar3 < 0) goto LAB_00734f3f;
        pVVar7 = p->vAssumps;
        iVar3 = iVar3 * 2 + 1;
LAB_00734ba2:
        Vec_IntPush(pVVar7,iVar3);
      }
      iVar9 = iVar9 + 1;
      pGVar4 = p->pAig;
      iVar3 = pGVar4->nRegs;
      uVar8 = uVar8 + 2;
    } while (iVar9 < iVar3);
  }
  if (pNext != (Gia_StaAre_t *)0x0) {
    pGVar4 = p->pAig;
    iVar3 = pGVar4->nRegs;
    if (0 < iVar3) {
      uVar8 = 0;
      iVar9 = 0;
      do {
        if (((uint)(&pNext[1].iPrev)[(int)uVar8 >> 5] >> (uVar8 & 0x1e) & 1) == 0) {
          if (((uint)(&pNext[1].iPrev)[(int)uVar8 >> 5] >> (sbyte)(uVar8 & 0x1e) & 2) != 0) {
            uVar6 = (pGVar4->vCos->nSize - iVar3) + iVar9;
            if ((-1 < (int)uVar6) && ((int)uVar6 < p->vSatNumCos->nSize)) {
              iVar3 = p->vSatNumCos->pArray[uVar6];
              if (-1 < iVar3) {
                pVVar7 = p->vAssumps;
                iVar3 = iVar3 * 2;
                goto LAB_00734c7a;
              }
              goto LAB_00734f3f;
            }
            goto LAB_00734f01;
          }
        }
        else {
          uVar6 = (pGVar4->vCos->nSize - iVar3) + iVar9;
          if (((int)uVar6 < 0) || (p->vSatNumCos->nSize <= (int)uVar6)) goto LAB_00734f01;
          iVar3 = p->vSatNumCos->pArray[uVar6];
          if (iVar3 < 0) goto LAB_00734f3f;
          pVVar7 = p->vAssumps;
          iVar3 = iVar3 * 2 + 1;
LAB_00734c7a:
          Vec_IntPush(pVVar7,iVar3);
        }
        iVar9 = iVar9 + 1;
        pGVar4 = p->pAig;
        iVar3 = pGVar4->nRegs;
        uVar8 = uVar8 + 2;
      } while (iVar9 < iVar3);
    }
  }
  if (-1 < iOutFailed) {
    if (p->pAig->vCos->nSize - p->pAig->nRegs <= iOutFailed) {
      __assert_fail("iOutFailed < Gia_ManPoNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                    ,0x752,
                    "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                   );
    }
    if (p->vSatNumCos->nSize <= iOutFailed) {
LAB_00734f01:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = p->vSatNumCos->pArray[(uint)iOutFailed];
    if (iVar3 < 0) {
LAB_00734f3f:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(p->vAssumps,iVar3 * 2);
  }
  begin = p->vAssumps->pArray;
  iVar3 = sat_solver_solve((sat_solver *)p->pSat,begin,begin + p->vAssumps->nSize,1000000,0,0,0);
  if (iVar3 != 1) {
    puts("SAT problem is not satisfiable. Failure...");
    return;
  }
  p->vCofVars->nSize = 0;
  pGVar4 = p->pAig;
  pVVar7 = pGVar4->vCis;
  if (pGVar4->nRegs < pVVar7->nSize) {
    lVar10 = 0;
    do {
      if (p->vSatNumCis->nSize <= lVar10) goto LAB_00734f01;
      iVar3 = p->vSatNumCis->pArray[lVar10];
      if (((long)iVar3 < 0) || (*p->pSat <= iVar3)) goto LAB_00734f20;
      if (*(int *)(*(long *)((long)p->pSat + 0x148) + (long)iVar3 * 4) == 1) {
        Vec_IntPush(p->vCofVars,(int)lVar10);
      }
      lVar10 = lVar10 + 1;
      pGVar4 = p->pAig;
      pVVar7 = pGVar4->vCis;
    } while (lVar10 < (long)pVVar7->nSize - (long)pGVar4->nRegs);
  }
  iVar3 = pGVar4->nRegs;
  if (0 < iVar3) {
    uVar8 = 0;
    iVar9 = 0;
    do {
      GVar1 = (&pCur[1].iPrev)[(int)uVar8 >> 5];
      sVar5 = (sbyte)(uVar8 & 0x1e);
      if (((uint)GVar1 >> (uVar8 & 0x1e) & 1) == 0) {
        if (((uint)GVar1 >> sVar5 & 2) != 0) {
          uVar6 = (pVVar7->nSize - iVar3) + iVar9;
          if (((int)uVar6 < 0) || (p->vSatNumCis->nSize <= (int)uVar6)) goto LAB_00734f01;
          iVar2 = p->vSatNumCis->pArray[uVar6];
          if (((long)iVar2 < 0) || (*p->pSat <= iVar2)) {
LAB_00734f20:
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (*(int *)(*(long *)((long)p->pSat + 0x148) + (long)iVar2 * 4) != 1) {
            __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                          ,0x76b,
                          "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                         );
          }
        }
      }
      else {
        uVar6 = (pVVar7->nSize - iVar3) + iVar9;
        if (((int)uVar6 < 0) || (p->vSatNumCis->nSize <= (int)uVar6)) goto LAB_00734f01;
        iVar2 = p->vSatNumCis->pArray[uVar6];
        if (((long)iVar2 < 0) || (*p->pSat <= iVar2)) goto LAB_00734f20;
        if (*(int *)(*(long *)((long)p->pSat + 0x148) + (long)iVar2 * 4) == 1) {
          __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                        ,0x769,
                        "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                       );
        }
      }
      uVar6 = (pVVar7->nSize - iVar3) + iVar9;
      if (((int)uVar6 < 0) || (p->vSatNumCis->nSize <= (int)uVar6)) goto LAB_00734f01;
      iVar3 = p->vSatNumCis->pArray[uVar6];
      if (((long)iVar3 < 0) || (*p->pSat <= iVar3)) goto LAB_00734f20;
      (&pCur[1].iPrev)[(int)uVar8 >> 5] =
           (Gia_PtrAre_t)
           ((*(int *)(*(long *)((long)p->pSat + 0x148) + (long)iVar3 * 4) == 1) + 1 << sVar5 |
           (uint)GVar1);
      iVar9 = iVar9 + 1;
      iVar3 = pGVar4->nRegs;
      uVar8 = uVar8 + 2;
    } while (iVar9 < iVar3);
  }
  return;
}

Assistant:

void Gia_ManAreDeriveCexSat( Gia_ManAre_t * p, Gia_StaAre_t * pCur, Gia_StaAre_t * pNext, int iOutFailed )
{
    int i, status;
    // make assuptions
    Vec_IntClear( p->vAssumps );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 0 ) );
    }
    if ( pNext )
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 0 ) );
    }
    if ( iOutFailed >= 0 )
    {
        assert( iOutFailed < Gia_ManPoNum(p->pAig) );
        Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, iOutFailed), 0 ) );
    }
    // solve SAT
    status = sat_solver_solve( (sat_solver *)p->pSat, (int *)Vec_IntArray(p->vAssumps), (int *)Vec_IntArray(p->vAssumps) + Vec_IntSize(p->vAssumps), 
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "SAT problem is not satisfiable. Failure...\n" );
        return;
    }
    assert( status == l_True );
    // check the model
    Vec_IntClear( p->vCofVars );
    for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
    {
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, i) ) )
            Vec_IntPush( p->vCofVars, i );
    }
    // write the current state
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 );
        else if ( Gia_StaHasValue1(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1 );
        // set don't-care value
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 )
            Gia_StaSetValue0( pCur, i );
        else
            Gia_StaSetValue1( pCur, i );
    }
}